

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSet::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSet::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSet::Parameters>::Args>_>
::createInstance(InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSet::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSet::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSet::Parameters>::Args>_>
                 *this,Context *context)

{
  TestInstance *pTVar1;
  
  pTVar1 = (TestInstance *)operator_new(0x30);
  pTVar1->m_context = context;
  pTVar1->_vptr_TestInstance = (_func_int **)&PTR__FunctionInstance1_00bc9178;
  FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSet::Parameters>::Args::Args
            ((Args *)(pTVar1 + 1),&this->m_arg0);
  return pTVar1;
}

Assistant:

TestInstance*	createInstance		(Context& context) const { return new Instance(context, m_arg0); }